

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

int __thiscall soplex::SPxSteepPR<double>::selectLeaveHyper(SPxSteepPR<double> *this,double tol)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  char *pcVar5;
  int *piVar6;
  int n;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  DIdxSet *in_RDI;
  double in_XMM0_Qa;
  double dVar7;
  int i_1;
  int i;
  int idx;
  int bestIdx;
  double x;
  double best;
  double leastBest;
  double *fTest;
  double *coPen;
  int in_stack_ffffffffffffffac;
  uint local_48;
  uint local_44;
  int local_3c;
  double local_30;
  double local_28;
  
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e67e9);
  SPxSolverBase<double>::fTest((SPxSolverBase<double> *)(in_RDI->super_IdxSet).idx);
  pdVar3 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e6807);
  local_28 = -1.0;
  pdVar4 = (double *)infinity();
  local_30 = -*pdVar4;
  local_3c = -1;
  local_44 = IdxSet::size((IdxSet *)&in_RDI[8].super_IdxSet.num);
  iVar1 = extraout_EDX;
  while (local_44 = local_44 - 1, -1 < (int)local_44) {
    pcVar5 = IdxSet::index((IdxSet *)&in_RDI[8].super_IdxSet.num,(char *)(ulong)local_44,iVar1);
    iVar1 = (int)pcVar5;
    if (-in_XMM0_Qa <= pdVar3[iVar1]) {
      IdxSet::remove((IdxSet *)&in_RDI[8].super_IdxSet.num,(char *)(ulong)local_44);
      piVar6 = DataArray<int>::operator[]
                         ((DataArray<int> *)((in_RDI->super_IdxSet).idx + 0x21a),iVar1);
      *piVar6 = 0;
      iVar1 = extraout_EDX_01;
    }
    else {
      dVar7 = steeppr::computePrice<double>(pdVar3[iVar1],pdVar2[iVar1],in_XMM0_Qa);
      if (local_30 < dVar7) {
        local_3c = iVar1;
        local_30 = dVar7;
      }
      iVar1 = extraout_EDX_00;
      if ((dVar7 < local_28) || (local_28 < 0.0)) {
        local_28 = dVar7;
      }
    }
  }
  local_48 = IdxSet::size((IdxSet *)((in_RDI->super_IdxSet).idx + 0x20a));
  iVar1 = extraout_EDX_02;
  while (local_48 = local_48 - 1, -1 < (int)local_48) {
    pcVar5 = IdxSet::index((IdxSet *)((in_RDI->super_IdxSet).idx + 0x20a),(char *)(ulong)local_48,
                           iVar1);
    n = (int)pcVar5;
    piVar6 = DataArray<int>::operator[]((DataArray<int> *)((in_RDI->super_IdxSet).idx + 0x21a),n);
    iVar1 = extraout_EDX_03;
    if ((*piVar6 == 1) &&
       (dVar7 = steeppr::computePrice<double>(pdVar3[n],pdVar2[n],in_XMM0_Qa),
       iVar1 = extraout_EDX_04, local_28 < dVar7)) {
      if (local_30 < dVar7) {
        local_3c = n;
        local_30 = dVar7;
      }
      piVar6 = DataArray<int>::operator[]((DataArray<int> *)((in_RDI->super_IdxSet).idx + 0x21a),n);
      *piVar6 = 2;
      DIdxSet::addIdx(in_RDI,in_stack_ffffffffffffffac);
      iVar1 = extraout_EDX_05;
    }
  }
  return local_3c;
}

Assistant:

int SPxSteepPR<R>::selectLeaveHyper(R tol)
{
   const R* coPen = this->thesolver->coWeights.get_const_ptr();
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   R leastBest = -1;
   R best = R(-infinity);
   R x;
   int bestIdx = -1;
   int idx = 0;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -tol)
      {
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         x = steeppr::computePrice(x, coPen[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bestIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // is this index a candidate for bestPrices?
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -tol);
         x = steeppr::computePrice(x, coPen[idx], tol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bestIdx = idx;
            }

            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bestIdx;
}